

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Bool prvTidySetXHTMLDocType(TidyDocImpl *doc)

{
  int iVar1;
  uint uVar2;
  Lexer *pLVar3;
  uint uVar4;
  tmbstr ptVar5;
  Node *node;
  AttVal *pAVar6;
  Bool BVar7;
  Bool BVar8;
  
  if (doc == (TidyDocImpl *)0x0) {
    node = (Node *)0x0;
  }
  else {
    node = (doc->root).content;
  }
  pLVar3 = doc->lexer;
  for (; (node != (Node *)0x0 && (node->type != DocTypeTag)); node = node->next) {
  }
  iVar1 = *(int *)((doc->config).value + 0xe);
  uVar4 = prvTidyApparentVersion(doc);
  pLVar3->versionEmitted = uVar4;
  if (iVar1 == 5) {
    if ((doc->config).value[0xd].v == 0) {
      return no;
    }
  }
  else if (iVar1 == 1) {
    BVar7 = yes;
    if (node == (Node *)0x0) {
      return yes;
    }
    goto LAB_001446d5;
  }
  if (node == (Node *)0x0) {
    node = NewDocTypeNode(doc);
    ptVar5 = prvTidytmbstrdup(doc->allocator,"html");
  }
  else {
    ptVar5 = prvTidytmbstrtolower(node->element);
  }
  node->element = ptVar5;
  BVar7 = no;
  BVar8 = no;
  switch(iVar1) {
  case 0:
    BVar8 = no;
    prvTidyRepairAttrValue(doc,node,"PUBLIC",(ctmbstr)0x0);
    prvTidyRepairAttrValue(doc,node,"SYSTEM",(ctmbstr)0x0);
    pLVar3->versionEmitted = 0x40000;
    break;
  case 2:
    uVar4 = pLVar3->doctype;
    if ((uVar4 == 0x60000) || (uVar4 == 0)) {
      pLVar3->versionEmitted = 0x40000;
    }
    else {
      uVar2 = pLVar3->versions;
      if (uVar4 == 0x800 && (uVar2 >> 0xb & 1) != 0) {
        pAVar6 = prvTidyGetAttrByName(node,"SYSTEM");
        if (pAVar6 == (AttVal *)0x0) {
          prvTidyRepairAttrValue(doc,node,"SYSTEM","http://www.w3.org/TR/xhtml11/DTD/xhtml11.dtd");
        }
        pLVar3->versionEmitted = 0x800;
      }
      else {
        if ((uVar2 & 0xffc) == 0x800) {
          prvTidyRepairAttrValue(doc,node,"PUBLIC","-//W3C//DTD XHTML 1.1//EN");
          prvTidyRepairAttrValue(doc,node,"SYSTEM","http://www.w3.org/TR/xhtml11/DTD/xhtml11.dtd");
          pLVar3->versionEmitted = 0x800;
          return no;
        }
        if (uVar4 != 0x1000 || (uVar2 >> 0xc & 1) == 0) {
          if ((uVar2 & 0x124) == 0) {
            if ((uVar2 & 0x490) != 0) {
              prvTidyRepairAttrValue(doc,node,"PUBLIC","-//W3C//DTD XHTML 1.0 Frameset//EN");
              prvTidyRepairAttrValue
                        (doc,node,"SYSTEM","http://www.w3.org/TR/xhtml1/DTD/xhtml1-frameset.dtd");
              pLVar3->versionEmitted = 0x400;
              return no;
            }
            if ((uVar2 & 0x24b) == 0) {
              if (node == (Node *)0x0) {
                return no;
              }
              if ((uVar2 & 0x60000) != 0) {
                return no;
              }
LAB_001446d5:
              prvTidyDiscardElement(doc,node);
              return BVar7;
            }
            goto switchD_00144741_caseD_4;
          }
          goto switchD_00144741_caseD_3;
        }
        pAVar6 = prvTidyGetAttrByName(node,"SYSTEM");
        if (pAVar6 == (AttVal *)0x0) {
          prvTidyRepairAttrValue
                    (doc,node,"SYSTEM","http://www.w3.org/TR/xhtml-basic/xhtml-basic10.dtd");
        }
        pLVar3->versionEmitted = 0x1000;
      }
    }
    BVar8 = yes;
    break;
  case 3:
switchD_00144741_caseD_3:
    prvTidyRepairAttrValue(doc,node,"PUBLIC","-//W3C//DTD XHTML 1.0 Strict//EN");
    prvTidyRepairAttrValue(doc,node,"SYSTEM","http://www.w3.org/TR/xhtml1/DTD/xhtml1-strict.dtd");
    pLVar3->versionEmitted = 0x100;
    break;
  case 4:
switchD_00144741_caseD_4:
    prvTidyRepairAttrValue(doc,node,"PUBLIC","-//W3C//DTD XHTML 1.0 Transitional//EN");
    prvTidyRepairAttrValue
              (doc,node,"SYSTEM","http://www.w3.org/TR/xhtml1/DTD/xhtml1-transitional.dtd");
    pLVar3->versionEmitted = 0x200;
    break;
  case 5:
    prvTidyRepairAttrValue(doc,node,"PUBLIC",(doc->config).value[0xd].p);
    prvTidyRepairAttrValue(doc,node,"SYSTEM","");
  }
  return BVar8;
}

Assistant:

Bool TY_(SetXHTMLDocType)( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    Node *doctype = TY_(FindDocType)( doc );
    TidyDoctypeModes dtmode = (TidyDoctypeModes)cfg(doc, TidyDoctypeMode);
    ctmbstr pub = "PUBLIC";
    ctmbstr sys = "SYSTEM";

    lexer->versionEmitted = TY_(ApparentVersion)( doc );

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)(doc, doctype);
        return yes;
    }

    if (dtmode == TidyDoctypeUser && !cfgStr(doc, TidyDoctype))
        return no;

    if (!doctype)
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }
    else
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }

    switch(dtmode)
    {
    case TidyDoctypeHtml5:
        /* HTML5 */
        TY_(RepairAttrValue)(doc, doctype, pub, NULL);
        TY_(RepairAttrValue)(doc, doctype, sys, NULL);
        lexer->versionEmitted = XH50;
        break;
    case TidyDoctypeStrict:
        /* XHTML 1.0 Strict */
        TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10S));
        TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10S));
        lexer->versionEmitted = X10S;
        break;
    case TidyDoctypeLoose:
        /* XHTML 1.0 Transitional */
        TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10T));
        TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10T));
        lexer->versionEmitted = X10T;
        break;
    case TidyDoctypeUser:
        /* user defined document type declaration */
        TY_(RepairAttrValue)(doc, doctype, pub, cfgStr(doc, TidyDoctype));
        TY_(RepairAttrValue)(doc, doctype, sys, "");
        break;
    case TidyDoctypeAuto:
        if (lexer->doctype == VERS_UNKNOWN || lexer->doctype == VERS_HTML5) {
          lexer->versionEmitted = XH50;
          return yes;
        }
        else if (lexer->versions & XH11 && lexer->doctype == XH11)
        {
            if (!TY_(GetAttrByName)(doctype, sys))
                TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XH11));
            lexer->versionEmitted = XH11;
            return yes;
        }
        else if (lexer->versions & XH11 && !(lexer->versions & VERS_HTML40))
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(XH11));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XH11));
            lexer->versionEmitted = XH11;
        }
        else if (lexer->versions & XB10 && lexer->doctype == XB10)
        {
            if (!TY_(GetAttrByName)(doctype, sys))
                TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XB10));
            lexer->versionEmitted = XB10;
            return yes;
        }
        else if (lexer->versions & VERS_HTML40_STRICT)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10S));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10S));
            lexer->versionEmitted = X10S;
        }
        else if (lexer->versions & VERS_FRAMESET)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10F));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10F));
            lexer->versionEmitted = X10F;
        }
        else if (lexer->versions & VERS_LOOSE)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10T));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10T));
            lexer->versionEmitted = X10T;
        }
        else if (lexer->versions & VERS_HTML5)
        {
            /*\
             *  Issue #273 - If still a html5/xhtml5 bit
             *  existing, that is the 'ConstrainVersion' has
             *  not eliminated all HTML5, then nothing to do here.
             *  Certainly do **not** delete the DocType node!
             *  see: http://www.w3.org/QA/Tips/Doctype
            \*/
        }
        else
        {
            if (doctype)
                TY_(DiscardElement)(doc, doctype);
            return no;
        }
        break;
    case TidyDoctypeOmit:
        assert(0);
        break;
    }

    return no;
}